

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManAddDsd_rec(char *pStr,char **p,int *pMatches,If_DsdMan_t *pMan,word *pTruth,
                       uchar *pPerm,int *pnSupp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int local_2e4;
  int nVarsF;
  int i;
  char *q_1;
  int pLits_1 [12];
  int local_29c;
  int nLits_1;
  word pFunc [64];
  char *q;
  int pLits [12];
  int nLits;
  int Type;
  int fCompl;
  int iRes;
  uchar *pPermStart;
  uchar *pPerm_local;
  word *pTruth_local;
  If_DsdMan_t *pMan_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  iVar3 = *pnSupp;
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  nLits = (int)(cVar1 == '!');
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p == '(') || (((**p == '[' || (**p == '<')) || (**p == '{')))) {
      pLits[0xb] = 0;
      pLits[10] = 0;
      pcVar5 = pStr + pMatches[(long)*p - (long)pStr];
      if (**p == '(') {
        pLits[0xb] = 3;
      }
      else if (**p == '[') {
        pLits[0xb] = 4;
      }
      else if (**p == '<') {
        pLits[0xb] = 5;
      }
      else {
        if (**p != '{') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x69b,
                        "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                       );
        }
        pLits[0xb] = 6;
      }
      if ((int)*pcVar5 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x69c,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      *p = *p + 1;
      while (*p < pcVar5) {
        iVar2 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
        lVar6 = (long)pLits[10];
        pLits[10] = pLits[10] + 1;
        pLits[lVar6 + -2] = iVar2;
        *p = *p + 1;
      }
      if (*p != pcVar5) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x69f,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      iVar3 = If_DsdManOperation(pMan,pLits[0xb],(int *)&q,pLits[10],pPerm + iVar3,pTruth);
      pStr_local._4_4_ = Abc_LitNotCond(iVar3,nLits);
    }
    else {
      if (((**p < 'A') || ('F' < **p)) && ((**p < '0' || ('9' < **p)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x6b3,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      local_29c = 0;
      iVar2 = Abc_TtReadHex((word *)&stack0xfffffffffffffd68,*p);
      iVar4 = Abc_TtHexDigitNum(iVar2);
      *p = *p + iVar4;
      pcVar5 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '{') || (*pcVar5 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x6ab,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      local_2e4 = 0;
      *p = *p + 1;
      while (*p < pcVar5) {
        iVar4 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
        pLits_1[(long)local_29c + -2] = iVar4;
        *p = *p + 1;
        local_2e4 = local_2e4 + 1;
        local_29c = local_29c + 1;
      }
      if (local_2e4 != iVar2) {
        __assert_fail("i == nVarsF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x6ae,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      if (*p != pcVar5) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x6af,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      iVar3 = If_DsdManOperation(pMan,6,(int *)&q_1,local_29c,pPerm + iVar3,
                                 (word *)&stack0xfffffffffffffd68);
      pStr_local._4_4_ = Abc_LitNotCond(iVar3,nLits);
    }
  }
  else {
    iVar2 = Abc_Var2Lit(**p + -0x61,nLits);
    iVar3 = *pnSupp;
    *pnSupp = iVar3 + 1;
    pPerm[iVar3] = (uchar)iVar2;
    pStr_local._4_4_ = 2;
  }
  return pStr_local._4_4_;
}

Assistant:

int If_DsdManAddDsd_rec( char * pStr, char ** p, int * pMatches, If_DsdMan_t * pMan, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    unsigned char * pPermStart = pPerm + *pnSupp;
    int iRes = -1, fCompl = 0;
    if ( **p == '!' )
    {
        fCompl = 1;
        (*p)++;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        pPerm[(*pnSupp)++] = Abc_Var2Lit( **p - 'a', fCompl );
        return 2;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Type = 0, nLits = 0, pLits[DAU_MAX_VAR];
        char * q = pStr + pMatches[ *p - pStr ];
        if ( **p == '(' )
            Type = DAU_DSD_AND;
        else if ( **p == '[' )
            Type = DAU_DSD_XOR;
        else if ( **p == '<' )
            Type = DAU_DSD_MUX;
        else if ( **p == '{' )
            Type = DAU_DSD_PRIME;
        else assert( 0 );
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, Type, pLits, nLits, pPermStart, pTruth );
        return Abc_LitNotCond( iRes, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFunc[DAU_MAX_WORD];
        int nLits = 0, pLits[DAU_MAX_VAR];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( i == nVarsF );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, DAU_DSD_PRIME, pLits, nLits, pPermStart, pFunc );
        return Abc_LitNotCond( iRes, fCompl );
    }
    assert( 0 );
    return -1;
}